

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_add_bool_option(void)

{
  int iVar1;
  int local_4c;
  char *pcStack_48;
  int a;
  char *args [3];
  cargo_t local_28;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    pcStack_48 = "program";
    args[0] = "--alpha";
    args[1] = "1";
    cargo._4_4_ = cargo_add_option(local_28,0,"--alpha -a","Description","b",&local_4c);
    if (cargo._4_4_ == 0) {
      iVar1 = cargo_parse(local_28,0,1,3,&stack0xffffffffffffffb8);
      if (iVar1 == 0) {
        printf("Attempt to parse value: 1\n");
        if (local_4c != 1) {
          pcStack_18 = "Failed to parse correct value 1";
        }
      }
      else {
        pcStack_18 = "Failed to parse int with value \"1\"";
      }
    }
    else {
      pcStack_18 = "Failed to add valid int option";
    }
    cargo_destroy(&local_28);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_add_static_string_option)
{
    char b[10];
    char *args[] = { "program", "--beta", "abc" };
    ret = cargo_add_option(cargo, 0, "--beta -b",
                            "Description",
                            ".s#",
                            &b, sizeof(b));
    cargo_assert(ret == 0, "Failed to add valid static string option");

    if (cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args))
    {
        msg = "Failed to parse static char * with value \"abc\"";
        goto fail;
    }
    printf("Attempt to parse value: abc\n");
    cargo_assert(!strcmp(b, "abc"), "Failed to parse correct value abc");
    _TEST_CLEANUP();
}